

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

RepeatedField<int> * __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::RepeatedField<int>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  RepeatedField<int> *pRVar4;
  OneofDescriptor *oneof_descriptor;
  string_view str;
  string_view v;
  LogMessage local_30;
  
  VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
  this_00 = &this->schema_;
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar2) {
    if ((field->field_0x1 & 0x10) == 0) {
      oneof_descriptor = (OneofDescriptor *)0x0;
    }
    else {
      oneof_descriptor = (field->scope_).containing_oneof;
      if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_001f924a;
    }
    uVar3 = GetOneofCase(this,message,oneof_descriptor);
    if (uVar3 != field->number_) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                 ,0x704,"!schema_.InRealOneof(field) || HasOneofField(message, field)");
      str._M_str = "Field = ";
      str._M_len = 8;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_30,str);
      pcVar1 = (field->all_names_).payload_;
      v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
      v._M_str = pcVar1 + ~v._M_len;
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_30,v);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
  }
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (!bVar2) {
    pRVar4 = GetRawNonOneof<google::protobuf::RepeatedField<int>>(this,message,field);
    return pRVar4;
  }
  bVar2 = internal::ReflectionSchema::IsSplit(this_00,field);
  if (!bVar2) {
    uVar3 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    return (RepeatedField<int> *)
           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  }
  GetRaw<google::protobuf::RepeatedField<int>>();
LAB_001f924a:
  internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb31);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  VerifyFieldType<Type>(field);
  ABSL_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();

  if (ABSL_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return GetRawNonOneof<Type>(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return internal::GetConstRefAtOffset<Type>(message, field_offset);
}